

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O1

MPP_RET mpp_service_reg_offset(void *ctx,MppDevRegOffsetCfg *cfg)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  RegOffsetInfo *pRVar4;
  MPP_RET MVar5;
  long lVar6;
  
  MVar5 = MPP_OK;
  if (cfg->offset != 0) {
    iVar2 = *(int *)((long)ctx + 0x44);
    if ((long)iVar2 < 0x40) {
      if (0 < iVar2) {
        lVar6 = 0;
        do {
          uVar3 = *(uint *)(*(long *)((long)ctx + 0x38) + (long)*(int *)((long)ctx + 0x48) * 8 +
                           lVar6 * 8);
          if (uVar3 == cfg->reg_idx) {
            lVar1 = *(long *)((long)ctx + 0x38) + (long)*(int *)((long)ctx + 0x48) * 8;
            _mpp_log_l(2,"mpp_serivce","reg[%d] offset has been set, cover old %d -> %d\n",
                       "mpp_service_reg_offset",(ulong)uVar3,(ulong)*(uint *)(lVar1 + 4 + lVar6 * 8)
                       ,CONCAT44((int)((ulong)in_RAX >> 0x20),cfg->offset));
            *(RK_U32 *)(lVar1 + 4 + lVar6 * 8) = cfg->offset;
            return MPP_OK;
          }
          lVar6 = lVar6 + 1;
        } while (iVar2 != lVar6);
      }
      pRVar4 = mpp_service_next_reg_offset((MppDevMppService *)ctx);
      pRVar4->reg_idx = cfg->reg_idx;
      pRVar4->offset = cfg->offset;
      MVar5 = MPP_OK;
    }
    else {
      _mpp_log_l(2,"mpp_serivce","reach max offset definition\n","mpp_service_reg_offset",0x40);
      MVar5 = MPP_NOK;
    }
  }
  return MVar5;
}

Assistant:

MPP_RET mpp_service_reg_offset(void *ctx, MppDevRegOffsetCfg *cfg)
{
    MppDevMppService *p = (MppDevMppService *)ctx;
    RegOffsetInfo *info;
    RK_S32 i;

    if (!cfg->offset)
        return MPP_OK;

    if (p->reg_offset_count >= MAX_REG_OFFSET) {
        mpp_err_f("reach max offset definition\n", MAX_REG_OFFSET);
        return MPP_NOK;
    }

    for (i = 0; i < p->reg_offset_count; i++) {
        info = &p->reg_offset_info[p->reg_offset_pos + i];

        if (info->reg_idx == cfg->reg_idx) {
            mpp_err_f("reg[%d] offset has been set, cover old %d -> %d\n",
                      info->reg_idx, info->offset, cfg->offset);
            info->offset = cfg->offset;
            return MPP_OK;
        }
    }

    info = mpp_service_next_reg_offset(p);
    info->reg_idx = cfg->reg_idx;
    info->offset = cfg->offset;

    return MPP_OK;
}